

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# column_list.cpp
# Opt level: O0

ColumnList * __thiscall duckdb::ColumnList::Copy(ColumnList *this)

{
  bool bVar1;
  ColumnDefinition *in_RSI;
  ColumnDefinition *in_RDI;
  ColumnDefinition *col;
  const_iterator __end1;
  const_iterator __begin1;
  vector<duckdb::ColumnDefinition,_true> *__range1;
  ColumnList *result;
  ColumnDefinition *this_00;
  ColumnList *in_stack_fffffffffffffee0;
  ColumnDefinition *in_stack_ffffffffffffff48;
  __normal_iterator<const_duckdb::ColumnDefinition_*,_std::vector<duckdb::ColumnDefinition,_std::allocator<duckdb::ColumnDefinition>_>_>
  a_Stack_28 [2];
  undefined1 uStack_11;
  
  uStack_11 = 0;
  this_00 = in_RDI;
  ColumnList((ColumnList *)in_RDI,SUB81((ulong)in_RDI >> 0x38,0));
  a_Stack_28[0]._M_current =
       (ColumnDefinition *)
       ::std::vector<duckdb::ColumnDefinition,_std::allocator<duckdb::ColumnDefinition>_>::begin
                 (in_RDI);
  ::std::vector<duckdb::ColumnDefinition,_std::allocator<duckdb::ColumnDefinition>_>::end
            ((vector<duckdb::ColumnDefinition,_std::allocator<duckdb::ColumnDefinition>_> *)in_RDI);
  while (bVar1 = __gnu_cxx::
                 operator!=<const_duckdb::ColumnDefinition_*,_std::vector<duckdb::ColumnDefinition,_std::allocator<duckdb::ColumnDefinition>_>_>
                           ((__normal_iterator<const_duckdb::ColumnDefinition_*,_std::vector<duckdb::ColumnDefinition,_std::allocator<duckdb::ColumnDefinition>_>_>
                             *)this_00,
                            (__normal_iterator<const_duckdb::ColumnDefinition_*,_std::vector<duckdb::ColumnDefinition,_std::allocator<duckdb::ColumnDefinition>_>_>
                             *)in_RDI), bVar1) {
    __gnu_cxx::
    __normal_iterator<const_duckdb::ColumnDefinition_*,_std::vector<duckdb::ColumnDefinition,_std::allocator<duckdb::ColumnDefinition>_>_>
    ::operator*(a_Stack_28);
    ColumnDefinition::Copy(in_stack_ffffffffffffff48);
    AddColumn(in_stack_fffffffffffffee0,in_RSI);
    ColumnDefinition::~ColumnDefinition(this_00);
    __gnu_cxx::
    __normal_iterator<const_duckdb::ColumnDefinition_*,_std::vector<duckdb::ColumnDefinition,_std::allocator<duckdb::ColumnDefinition>_>_>
    ::operator++(a_Stack_28);
  }
  return (ColumnList *)this_00;
}

Assistant:

ColumnList ColumnList::Copy() const {
	ColumnList result(allow_duplicate_names);
	for (auto &col : columns) {
		result.AddColumn(col.Copy());
	}
	return result;
}